

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O2

void __thiscall xe::ri::SampleList::SampleList(SampleList *this)

{
  (this->super_Item).m_type = TYPE_SAMPLELIST;
  (this->super_Item)._vptr_Item = (_func_int **)&PTR__SampleList_0011c950;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->description)._M_dataplus._M_p = (pointer)&(this->description).field_2;
  (this->description)._M_string_length = 0;
  (this->description).field_2._M_local_buf[0] = '\0';
  SampleInfo::SampleInfo(&this->sampleInfo);
  List::List(&this->samples);
  return;
}

Assistant:

SampleList		(void) : Item(TYPE_SAMPLELIST) {}